

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_deflateEnd(lzham_z_streamp pStream)

{
  lzham_uint32 lVar1;
  long in_RDI;
  lzham_compress_state_ptr pComp;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDI == 0) {
    iVar2 = -2;
  }
  else {
    if (*(long *)(in_RDI + 0x38) != 0) {
      lVar1 = lzham_lib_compress_deinit
                        ((lzham_compress_state_ptr)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      *(ulong *)(in_RDI + 0x60) = (ulong)lVar1;
      *(undefined8 *)(in_RDI + 0x38) = 0;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int lzham_lib_z_deflateEnd(lzham_z_streamp pStream)
   {
      if (!pStream)
      {
         LZHAM_LOG_ERROR(6041);
         return LZHAM_Z_STREAM_ERROR;
      }

      lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
      if (pComp)
      {
         pStream->adler = lzham_lib_compress_deinit(pComp);

         pStream->state = NULL;
      }

      return LZHAM_Z_OK;
   }